

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::InterpolateKeys
          (FBXConverter *this,aiVectorKey *valOut,KeyTimeList *keys,KeyFrameListList *inputs,
          aiVector3D *def_value,double *max_time,double *min_time)

{
  float fVar1;
  long lVar2;
  pointer ptVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  ulong uVar10;
  size_type __new_size;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  double dVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> next_pos;
  double local_88;
  float local_80;
  long *local_78;
  FBXConverter *local_70;
  double *local_68;
  pointer local_60;
  pointer local_58;
  aiVector3D *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_70 = this;
  local_68 = max_time;
  local_50 = def_value;
  if ((keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
LAB_0017be07:
    __assert_fail("!keys.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xcf4,
                  "void Assimp::FBX::FBXConverter::InterpolateKeys(aiVectorKey *, const KeyTimeList &, const KeyFrameListList &, const aiVector3D &, double &, double &)"
                 );
  }
  if (valOut == (aiVectorKey *)0x0) {
    __assert_fail("nullptr != valOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xcf5,
                  "void Assimp::FBX::FBXConverter::InterpolateKeys(aiVectorKey *, const KeyTimeList &, const KeyFrameListList &, const aiVector3D &, double &, double &)"
                 );
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = (inputs->
             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (inputs->
             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  __new_size = ((long)local_60 - (long)local_58 >> 3) * -0x3333333333333333;
  local_88 = (double)((ulong)local_88 & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_48,__new_size,(value_type_conflict1 *)&local_88);
  plVar8 = (keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_78 = (keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
  if (plVar8 != local_78) {
    do {
      lVar2 = *plVar8;
      local_88 = *(double *)local_50;
      local_80 = local_50->z;
      if (local_60 != local_58) {
        lVar13 = 6;
        lVar14 = 0;
        do {
          ptVar3 = (inputs->
                   super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          plVar4 = *(long **)((long)&(ptVar3->
                                     super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                     ).
                                     super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                     .super__Tuple_impl<2UL,_unsigned_int> + lVar13 * 4);
          lVar5 = *plVar4;
          lVar9 = plVar4[1] - lVar5;
          if (lVar9 != 0) {
            uVar10 = lVar9 >> 3;
            uVar12 = (ulong)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar14];
            if ((uVar12 < uVar10) && (*(long *)(lVar5 + uVar12 * 8) == lVar2)) {
              local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14] =
                   local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14] + 1;
              uVar12 = (ulong)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar14];
            }
            uVar11 = (ulong)((int)uVar12 - 1);
            if ((int)uVar12 == 0) {
              uVar11 = 0;
            }
            uVar7 = uVar10 - 1;
            if (uVar10 != uVar12) {
              uVar7 = uVar12;
            }
            plVar4 = *(long **)((long)ptVar3 + lVar13 * 4 + -0x10);
            lVar5 = *plVar4;
            uVar10 = plVar4[1] - lVar5 >> 2;
            if (uVar11 < uVar10) {
              if (uVar10 <= uVar7) {
LAB_0017bdd7:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar7);
                goto LAB_0017bde8;
              }
              plVar4 = *(long **)((long)&(ptVar3->
                                         super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         ).
                                         super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         .super__Tuple_impl<2UL,_unsigned_int> + lVar13 * 4);
              lVar9 = *plVar4;
              uVar10 = plVar4[1] - lVar9 >> 3;
              if (uVar10 <= uVar11) {
                uVar7 = std::__throw_out_of_range_fmt
                                  (
                                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  );
                goto LAB_0017bdd7;
              }
              if (uVar7 < uVar10) {
                lVar6 = *(long *)(lVar9 + uVar11 * 8);
                fVar15 = 0.0;
                lVar9 = *(long *)(lVar9 + uVar7 * 8) - lVar6;
                if (lVar9 != 0) {
                  fVar15 = (float)(lVar2 - lVar6) / (float)lVar9;
                }
                fVar1 = *(float *)(lVar5 + uVar11 * 4);
                *(float *)((long)&local_88 + (ulong)*(uint *)((long)ptVar3 + lVar13 * 4 + -0x18) * 4
                          ) = (*(float *)(lVar5 + uVar7 * 4) - fVar1) * fVar15 + fVar1;
                goto LAB_0017bd2e;
              }
            }
            else {
LAB_0017bde8:
              uVar7 = std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
            }
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar7);
            goto LAB_0017be07;
          }
LAB_0017bd2e:
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 10;
        } while (__new_size + (__new_size == 0) != lVar14);
      }
      dVar16 = ((double)lVar2 / 46186158000.0) * local_70->anim_fps;
      valOut->mTime = dVar16;
      if (*min_time <= dVar16) {
        dVar16 = *min_time;
      }
      *min_time = dVar16;
      dVar16 = valOut->mTime;
      if (valOut->mTime <= *local_68) {
        dVar16 = *local_68;
      }
      *local_68 = dVar16;
      *(double *)&valOut->mValue = local_88;
      (valOut->mValue).z = local_80;
      valOut = valOut + 1;
      plVar8 = plVar8 + 1;
    } while (plVar8 != local_78);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::InterpolateKeys(aiVectorKey* valOut, const KeyTimeList& keys, const KeyFrameListList& inputs,
            const aiVector3D& def_value,
            double& max_time,
            double& min_time) {
            ai_assert(!keys.empty());
            ai_assert(nullptr != valOut);

            std::vector<unsigned int> next_pos;
            const size_t count(inputs.size());

            next_pos.resize(inputs.size(), 0);

            for (KeyTimeList::value_type time : keys) {
                ai_real result[3] = { def_value.x, def_value.y, def_value.z };

                for (size_t i = 0; i < count; ++i) {
                    const KeyFrameList& kfl = inputs[i];

                    const size_t ksize = std::get<0>(kfl)->size();
                    if (ksize == 0) {
                        continue;
                    }
                    if (ksize > next_pos[i] && std::get<0>(kfl)->at(next_pos[i]) == time) {
                        ++next_pos[i];
                    }

                    const size_t id0 = next_pos[i] > 0 ? next_pos[i] - 1 : 0;
                    const size_t id1 = next_pos[i] == ksize ? ksize - 1 : next_pos[i];

                    // use lerp for interpolation
                    const KeyValueList::value_type valueA = std::get<1>(kfl)->at(id0);
                    const KeyValueList::value_type valueB = std::get<1>(kfl)->at(id1);

                    const KeyTimeList::value_type timeA = std::get<0>(kfl)->at(id0);
                    const KeyTimeList::value_type timeB = std::get<0>(kfl)->at(id1);

                    const ai_real factor = timeB == timeA ? ai_real(0.) : static_cast<ai_real>((time - timeA)) / (timeB - timeA);
                    const ai_real interpValue = static_cast<ai_real>(valueA + (valueB - valueA) * factor);

                    result[std::get<2>(kfl)] = interpValue;
                }

                // magic value to convert fbx times to seconds
                valOut->mTime = CONVERT_FBX_TIME(time) * anim_fps;

                min_time = std::min(min_time, valOut->mTime);
                max_time = std::max(max_time, valOut->mTime);

                valOut->mValue.x = result[0];
                valOut->mValue.y = result[1];
                valOut->mValue.z = result[2];

                ++valOut;
            }
        }